

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O0

Pair<char32_t,_unsigned_long> __thiscall
Corrade::Utility::Unicode::nextChar(Unicode *this,StringView text,size_t cursor)

{
  size_t sVar1;
  ostream *output;
  Debug *pDVar2;
  char *pcVar3;
  Pair<char32_t,_unsigned_long> PVar4;
  unsigned_long local_b8;
  char32_t local_ac;
  size_t local_a8;
  size_t i;
  unsigned_long uStack_98;
  char32_t result;
  char32_t local_8c;
  unsigned_long local_88;
  char32_t local_80;
  uint local_7c;
  ulong uStack_78;
  uint32_t mask;
  size_t end;
  uint32_t character;
  Flags local_59;
  Error local_58;
  size_t local_30;
  size_t cursor_local;
  StringView text_local;
  unsigned_long local_10;
  
  text_local._data = text._data;
  local_30 = text._sizePlusFlags;
  cursor_local = (size_t)this;
  sVar1 = Containers::BasicStringView<const_char>::size
                    ((BasicStringView<const_char> *)&cursor_local);
  if (sVar1 <= text._sizePlusFlags) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error(&local_58,output,local_59);
    pDVar2 = Debug::operator<<(&local_58.super_Debug,
                               "Utility::Unicode::nextChar(): expected cursor to be less than");
    sVar1 = Containers::BasicStringView<const_char>::size
                      ((BasicStringView<const_char> *)&cursor_local);
    pDVar2 = Debug::operator<<(pDVar2,sVar1);
    pDVar2 = Debug::operator<<(pDVar2,"but got");
    Debug::operator<<(pDVar2,local_30);
    Error::~Error(&local_58);
    abort();
  }
  pcVar3 = Containers::BasicStringView<const_char>::operator[]
                     ((BasicStringView<const_char> *)&cursor_local,local_30);
  end._0_4_ = (uint)*pcVar3;
  uStack_78 = local_30;
  if ((uint)end < 0x80) {
    uStack_78 = local_30 + 1;
    local_7c = 0x7f;
  }
  else if (((uint)end & 0xe0) == 0xc0) {
    uStack_78 = local_30 + 2;
    local_7c = 0x1f;
  }
  else if (((uint)end & 0xf0) == 0xe0) {
    uStack_78 = local_30 + 3;
    local_7c = 0xf;
  }
  else {
    if (((uint)end & 0xf8) != 0xf0) {
      local_80 = L'\xffffffff';
      local_88 = local_30 + 1;
      Containers::Pair<char32_t,_unsigned_long>::Pair
                ((Pair<char32_t,_unsigned_long> *)&text_local._sizePlusFlags,&local_80,&local_88);
      goto LAB_001766b4;
    }
    uStack_78 = local_30 + 4;
    local_7c = 7;
  }
  sVar1 = Containers::BasicStringView<const_char>::size
                    ((BasicStringView<const_char> *)&cursor_local);
  if (sVar1 < uStack_78) {
    local_8c = L'\xffffffff';
    uStack_98 = local_30 + 1;
    Containers::Pair<char32_t,_unsigned_long>::Pair
              ((Pair<char32_t,_unsigned_long> *)&text_local._sizePlusFlags,&local_8c,
               &stack0xffffffffffffff68);
  }
  else {
    i._4_4_ = (uint)end & local_7c;
    local_a8 = local_30;
    while (local_a8 = local_a8 + 1, local_a8 != uStack_78) {
      pcVar3 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&cursor_local,local_a8);
      if (((int)*pcVar3 & 0xc0U) != 0x80) {
        local_ac = L'\xffffffff';
        local_b8 = local_30 + 1;
        Containers::Pair<char32_t,_unsigned_long>::Pair
                  ((Pair<char32_t,_unsigned_long> *)&text_local._sizePlusFlags,&local_ac,&local_b8);
        goto LAB_001766b4;
      }
      i._4_4_ = i._4_4_ << 6;
      pcVar3 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&cursor_local,local_a8);
      i._4_4_ = (int)*pcVar3 & 0x3fU | i._4_4_;
    }
    Containers::Pair<char32_t,_unsigned_long>::Pair
              ((Pair<char32_t,_unsigned_long> *)&text_local._sizePlusFlags,
               (char32_t *)((long)&i + 4),&stack0xffffffffffffff88);
  }
LAB_001766b4:
  PVar4._4_4_ = 0;
  PVar4._first = (uint)text_local._sizePlusFlags;
  PVar4._second = local_10;
  return PVar4;
}

Assistant:

Containers::Pair<char32_t, std::size_t> nextChar(const Containers::StringView text, const std::size_t cursor) {
    CORRADE_DEBUG_ASSERT(cursor < text.size(),
        "Utility::Unicode::nextChar(): expected cursor to be less than" << text.size() << "but got" << cursor, {});

    std::uint32_t character = text[cursor];
    std::size_t end = cursor;
    std::uint32_t mask;

    /** @todo assert for overlong sequences */

    /* Sequence size */
    if(character < 0x80) {
        end += 1;
        mask = 0x7f;
    } else if((character & 0xe0) == 0xc0) {
        end += 2;
        mask = 0x1f;
    } else if((character & 0xf0) == 0xe0) {
        end += 3;
        mask = 0x0f;
    } else if((character & 0xf8) == 0xf0) {
        end += 4;
        mask = 0x07;

    /* Wrong sequence start */
    } else return {U'\xffffffff', cursor+1};

    /* Unexpected end */
    if(text.size() < end) return {U'\xffffffff', cursor+1};

    /* Compute the codepoint */
    char32_t result = character & mask;
    for(std::size_t i = cursor + 1; i != end; ++i) {
        /* Garbage in the sequence */
        if((text[i] & 0xc0) != 0x80)
            return {U'\xffffffff', cursor+1};

        result <<= 6;
        result |= (text[i] & 0x3f);
    }

    return {result, end};
}